

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

void __thiscall
aeron::archive::AeronArchive::truncateRecording
          (AeronArchive *this,int64_t recordingId,int64_t position)

{
  anon_class_24_3_d8e8af50 local_58;
  function<bool_(long)> local_40;
  int64_t local_20;
  int64_t position_local;
  int64_t recordingId_local;
  AeronArchive *this_local;
  
  local_58.recordingId = &position_local;
  local_58.position = &local_20;
  local_58.this = this;
  local_20 = position;
  position_local = recordingId;
  recordingId_local = (int64_t)this;
  std::function<bool(long)>::
  function<aeron::archive::AeronArchive::truncateRecording(long,long)::__0,void>
            ((function<bool(long)> *)&local_40,&local_58);
  callAndPollForResponse(this,&local_40,"truncate recording");
  std::function<bool_(long)>::~function(&local_40);
  return;
}

Assistant:

void AeronArchive::truncateRecording(std::int64_t recordingId, std::int64_t position) {
    callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->truncateRecording(recordingId, position, correlationId, controlSessionId_);
        },
        "truncate recording");
}